

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O1

bool anon_unknown.dwarf_bd938::testOptional(void)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  bool bVar4;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> str;
  cmJSONState state;
  Value v;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  *local_d0;
  Value *local_c8;
  long *local_c0 [2];
  long local_b0 [2];
  char local_a0;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  local_98;
  vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_> vStack_80;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  Value local_40;
  
  Json::Value::Value(&local_40,"Hello");
  vStack_80.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_80.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_80.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60 = 0;
  local_58 = 0;
  local_c0[0] = local_b0;
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"default","");
  local_a0 = '\x01';
  local_c8 = &local_40;
  if ((anonymous_namespace)::OptionalStringHelper_abi_cxx11_._16_8_ == 0) {
LAB_001b7368:
    local_d0 = &local_98;
    std::__throw_bad_function_call();
  }
  local_d0 = &local_98;
  cVar1 = (*(code *)(anonymous_namespace)::OptionalStringHelper_abi_cxx11_._24_8_)
                    ((anonymous_namespace)::OptionalStringHelper_abi_cxx11_,local_c0,&local_c8,
                     &local_d0);
  if (cVar1 == '\0') {
    iVar2 = 0x1b5;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ASSERT_TRUE(OptionalStringHelper(str, &v, &state)) failed on line ",0x42);
  }
  else {
    if (local_a0 == '\x01') {
      iVar2 = std::__cxx11::string::compare((char *)local_c0);
      if (iVar2 == 0) {
        std::optional<std::__cxx11::string>::emplace<char_const(&)[8]>
                  ((optional<std::__cxx11::string> *)local_c0,(char (*) [8])0x9908df);
        local_c8 = (Value *)0x0;
        if ((anonymous_namespace)::OptionalStringHelper_abi_cxx11_._16_8_ == 0) goto LAB_001b7368;
        local_d0 = &local_98;
        cVar1 = (*(code *)(anonymous_namespace)::OptionalStringHelper_abi_cxx11_._24_8_)
                          ((anonymous_namespace)::OptionalStringHelper_abi_cxx11_,local_c0,&local_c8
                           ,&local_d0);
        if (cVar1 == '\0') {
          iVar2 = 0x1b9;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(OptionalStringHelper(str, nullptr, &state)) failed on line ",0x47)
          ;
        }
        else {
          bVar4 = true;
          if (local_a0 != '\x01') goto LAB_001b7261;
          iVar2 = 0x1ba;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ASSERT_TRUE(str == cm::nullopt) failed on line ",0x2f);
        }
        goto LAB_001b723d;
      }
    }
    iVar2 = 0x1b6;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str == \"Hello\") failed on line ",0x2b);
  }
LAB_001b723d:
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  bVar4 = false;
LAB_001b7261:
  if (local_a0 == '\x01') {
    local_a0 = '\0';
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0],local_b0[0] + 1);
    }
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  std::vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>::~vector(&vStack_80);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ::~vector(&local_98);
  Json::Value::~Value(&local_40);
  return bVar4;
}

Assistant:

bool testOptional()
{
  Json::Value v = "Hello";
  cmJSONState state;

  cm::optional<std::string> str{ "default" };
  ASSERT_TRUE(OptionalStringHelper(str, &v, &state));
  ASSERT_TRUE(str == "Hello");

  str.emplace("default");
  ASSERT_TRUE(OptionalStringHelper(str, nullptr, &state));
  ASSERT_TRUE(str == cm::nullopt);

  return true;
}